

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

rnndecaddrinfo *
trymatch(rnndeccontext *ctx,rnndelem **elems,int elemsnum,uint64_t addr,int write,int dwidth,
        uint64_t *indices,int indicesnum)

{
  int iVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  rnndelem **pprVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  rnndelem **pprVar7;
  char *pcVar8;
  uint64_t uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  uint64_t uVar15;
  long lVar16;
  undefined1 *puVar17;
  char **__ptr;
  undefined1 auStack_a8 [8];
  long local_a0;
  uint local_98;
  byte local_91;
  uint64_t local_90;
  rnnetype local_88;
  int local_84;
  ulong local_80;
  unsigned_long __vla_expr0;
  uint local_70;
  uint local_6c;
  int nindnum;
  int extraidx;
  char *name;
  char *tmp;
  uint64_t idx;
  uint64_t offset;
  int j;
  int i;
  rnndecaddrinfo *res;
  int dwidth_local;
  int write_local;
  uint64_t addr_local;
  rnndelem **pprStack_20;
  int elemsnum_local;
  rnndelem **elems_local;
  rnndeccontext *ctx_local;
  
  puVar17 = auStack_a8;
  elems_local = (rnndelem **)ctx;
  pprStack_20 = elems;
  addr_local._4_4_ = elemsnum;
  _dwidth_local = addr;
  res._4_4_ = write;
  res._0_4_ = dwidth;
  offset._4_4_ = 0;
  do {
    if (addr_local._4_4_ <= offset._4_4_) {
      return (rnndecaddrinfo *)0x0;
    }
    *(undefined8 *)(puVar17 + -8) = 0x109af5;
    iVar12 = rnndec_varmatch(*(rnndeccontext **)(puVar17 + 0x10),*(rnnvarinfo **)(puVar17 + 8));
    if (iVar12 != 0) {
      local_88 = pprStack_20[offset._4_4_]->type;
      if (local_88 == RNN_ETYPE_REG) {
        if (pprStack_20[offset._4_4_]->offset <= _dwidth_local) {
          if (pprStack_20[offset._4_4_]->stride == 0) {
            tmp = (char *)0x0;
            idx = _dwidth_local - pprStack_20[offset._4_4_]->offset;
          }
          else {
            tmp = (char *)((_dwidth_local - pprStack_20[offset._4_4_]->offset) /
                          pprStack_20[offset._4_4_]->stride);
            idx = (_dwidth_local - pprStack_20[offset._4_4_]->offset) %
                  pprStack_20[offset._4_4_]->stride;
          }
          local_90 = idx;
          if ((idx < (ulong)(long)(pprStack_20[offset._4_4_]->width / (int)res)) &&
             ((pprStack_20[offset._4_4_]->length == 0 ||
              (tmp < (char *)pprStack_20[offset._4_4_]->length)))) {
            *(undefined8 *)(puVar17 + -8) = 0x109c4a;
            _j = (rnndeccontext *)calloc(0x18,1);
            ((rnndecaddrinfo *)_j)->typeinfo = &pprStack_20[offset._4_4_]->typeinfo;
            ((rnndecaddrinfo *)_j)->width = pprStack_20[offset._4_4_]->width;
            __ptr = &((rnndecaddrinfo *)_j)->name;
            uVar2._0_4_ = elems_local[3]->width;
            uVar2._4_4_ = elems_local[3]->access;
            pcVar14 = pprStack_20[offset._4_4_]->name;
            uVar15 = elems_local[3]->stride;
            *(undefined8 *)(puVar17 + -8) = 0x109cbc;
            asprintf(__ptr,"%s%s%s",uVar2,pcVar14,uVar15);
            for (offset._0_4_ = 0; (int)offset < indicesnum; offset._0_4_ = (int)offset + 1) {
              *(undefined8 *)(puVar17 + -8) = 0x109ce8;
              pcVar14 = appendidx(*(rnndeccontext **)(puVar17 + 0x18),*(char **)(puVar17 + 0x10),
                                  *(uint64_t *)(puVar17 + 8));
              ((rnndecaddrinfo *)_j)->name = pcVar14;
            }
            if (pprStack_20[offset._4_4_]->length != 1) {
              *(undefined8 *)(puVar17 + -8) = 0x109d26;
              pcVar14 = appendidx(*(rnndeccontext **)(puVar17 + 0x18),*(char **)(puVar17 + 0x10),
                                  *(uint64_t *)(puVar17 + 8));
              ((rnndecaddrinfo *)_j)->name = pcVar14;
            }
            uVar15 = idx;
            if (idx != 0) {
              pcVar14 = ((rnndecaddrinfo *)_j)->name;
              uVar9 = elems_local[3]->length;
              uVar3 = elems_local[3]->stride;
              *(undefined8 *)(puVar17 + -8) = 0x109d6e;
              asprintf(&name,"%s+%s%#lx%s",pcVar14,uVar9,uVar15,uVar3);
              pcVar14 = ((rnndecaddrinfo *)_j)->name;
              *(undefined8 *)(puVar17 + -8) = 0x109d7b;
              free(pcVar14);
              ((rnndecaddrinfo *)_j)->name = name;
            }
            return (rnndecaddrinfo *)_j;
          }
        }
      }
      else if (local_88 == RNN_ETYPE_ARRAY) {
        if (pprStack_20[offset._4_4_]->offset <= _dwidth_local) {
          tmp = (char *)((_dwidth_local - pprStack_20[offset._4_4_]->offset) /
                        pprStack_20[offset._4_4_]->stride);
          idx = (_dwidth_local - pprStack_20[offset._4_4_]->offset) %
                pprStack_20[offset._4_4_]->stride;
          if ((pprStack_20[offset._4_4_]->length == 0) ||
             (tmp < (char *)pprStack_20[offset._4_4_]->length)) {
            uVar6._0_4_ = elems_local[3]->width;
            uVar6._4_4_ = elems_local[3]->access;
            pcVar14 = pprStack_20[offset._4_4_]->name;
            uVar15 = elems_local[3]->stride;
            *(undefined8 *)(puVar17 + -8) = 0x10a19f;
            asprintf((char **)&nindnum,"%s%s%s",uVar6,pcVar14,uVar15);
            for (offset._0_4_ = 0; (int)offset < indicesnum; offset._0_4_ = (int)offset + 1) {
              *(undefined8 *)(puVar17 + -8) = 0x10a1c7;
              _nindnum = appendidx(*(rnndeccontext **)(puVar17 + 0x18),*(char **)(puVar17 + 0x10),
                                   *(uint64_t *)(puVar17 + 8));
            }
            if (pprStack_20[offset._4_4_]->length != 1) {
              *(undefined8 *)(puVar17 + -8) = 0x10a1fa;
              _nindnum = appendidx(*(rnndeccontext **)(puVar17 + 0x18),*(char **)(puVar17 + 0x10),
                                   *(uint64_t *)(puVar17 + 8));
            }
            pprVar4 = elems_local;
            iVar1 = res._4_4_;
            iVar11 = (int)res;
            uVar15 = idx;
            pprVar7 = pprStack_20[offset._4_4_]->subelems;
            iVar12 = pprStack_20[offset._4_4_]->subelemsnum;
            *(undefined8 *)(puVar17 + -0x10) = 0;
            *(undefined4 *)(puVar17 + -8) = 0;
            *(undefined8 *)(puVar17 + -0x18) = 0x10a24a;
            _j = (rnndeccontext *)
                 trymatch((rnndeccontext *)pprVar4,pprVar7,iVar12,uVar15,iVar1,iVar11,
                          *(uint64_t **)(puVar17 + -0x10),*(int *)(puVar17 + -8));
            pcVar14 = _nindnum;
            if (_j != (rnndeccontext *)0x0) {
              pcVar8 = ((rnndecaddrinfo *)_j)->name;
              *(undefined8 *)(puVar17 + -8) = 0x10a276;
              asprintf(&name,"%s.%s",pcVar14,pcVar8);
              pcVar14 = _nindnum;
              *(undefined8 *)(puVar17 + -8) = 0x10a27f;
              free(pcVar14);
              pcVar14 = ((rnndecaddrinfo *)_j)->name;
              *(undefined8 *)(puVar17 + -8) = 0x10a28c;
              free(pcVar14);
              ((rnndecaddrinfo *)_j)->name = name;
              return (rnndecaddrinfo *)_j;
            }
            *(undefined8 *)(puVar17 + -8) = 0x10a2b1;
            _j = (rnndeccontext *)calloc(0x18,1);
            uVar3 = idx;
            pcVar14 = _nindnum;
            uVar15 = elems_local[3]->length;
            uVar9 = elems_local[3]->stride;
            *(undefined8 *)(puVar17 + -8) = 0x10a2e7;
            asprintf(&name,"%s+%s%#lx%s",pcVar14,uVar15,uVar3,uVar9);
            pcVar14 = _nindnum;
            *(undefined8 *)(puVar17 + -8) = 0x10a2f0;
            free(pcVar14);
            ((rnndecaddrinfo *)_j)->name = name;
            return (rnndecaddrinfo *)_j;
          }
        }
      }
      else if (local_88 == RNN_ETYPE_STRIPE) {
        tmp = (char *)0x0;
        while( true ) {
          pprVar7 = elems_local;
          iVar11 = res._4_4_;
          iVar12 = (int)res;
          local_91 = 1;
          if ((char *)pprStack_20[offset._4_4_]->length <= tmp) {
            local_91 = pprStack_20[offset._4_4_]->length != 0 ^ 0xff;
          }
          if (((local_91 & 1) == 0) ||
             (_dwidth_local <
              pprStack_20[offset._4_4_]->offset + pprStack_20[offset._4_4_]->stride * (long)tmp))
          break;
          uVar15 = _dwidth_local -
                   (pprStack_20[offset._4_4_]->offset +
                   pprStack_20[offset._4_4_]->stride * (long)tmp);
          idx = uVar15;
          uVar13 = (uint)(pprStack_20[offset._4_4_]->length != 1);
          local_6c = uVar13;
          if (pprStack_20[offset._4_4_]->name == (char *)0x0) {
            local_98 = indicesnum + uVar13;
          }
          else {
            local_98 = 0;
          }
          uVar10 = local_98;
          local_70 = local_98;
          __vla_expr0 = (unsigned_long)puVar17;
          lVar16 = (long)puVar17 - ((ulong)local_98 * 8 + 0xf & 0xfffffffffffffff0);
          local_a0 = lVar16;
          local_80 = (ulong)local_98;
          if (pprStack_20[offset._4_4_]->name == (char *)0x0) {
            for (offset._0_4_ = 0; (int)offset < indicesnum; offset._0_4_ = (int)offset + 1) {
              *(uint64_t *)(lVar16 + (long)(int)offset * 8) = indices[(int)offset];
            }
            if (uVar13 != 0) {
              *(char **)(lVar16 + (long)indicesnum * 8) = tmp;
            }
          }
          pprVar4 = pprStack_20[offset._4_4_]->subelems;
          iVar1 = pprStack_20[offset._4_4_]->subelemsnum;
          *(long *)(lVar16 + -0x10) = lVar16;
          *(uint *)(lVar16 + -8) = uVar10;
          *(undefined8 *)(lVar16 + -0x18) = 0x109f73;
          _j = (rnndeccontext *)
               trymatch((rnndeccontext *)pprVar7,pprVar4,iVar1,uVar15,iVar11,iVar12,
                        *(uint64_t **)(lVar16 + -0x10),*(int *)(lVar16 + -8));
          if (_j == (rnndeccontext *)0x0) {
            local_84 = 0xb;
          }
          else if (pprStack_20[offset._4_4_]->name == (char *)0x0) {
            ctx_local = _j;
            local_84 = 1;
          }
          else {
            uVar5._0_4_ = elems_local[3]->width;
            uVar5._4_4_ = elems_local[3]->access;
            pcVar14 = pprStack_20[offset._4_4_]->name;
            uVar15 = elems_local[3]->stride;
            *(undefined8 *)(lVar16 + -8) = 0x109fef;
            asprintf((char **)&nindnum,"%s%s%s",uVar5,pcVar14,uVar15);
            for (offset._0_4_ = 0; (int)offset < indicesnum; offset._0_4_ = (int)offset + 1) {
              *(undefined8 *)(lVar16 + -8) = 0x10a017;
              _nindnum = appendidx(*(rnndeccontext **)(lVar16 + 0x18),*(char **)(lVar16 + 0x10),
                                   *(uint64_t *)(lVar16 + 8));
            }
            if (pprStack_20[offset._4_4_]->length != 1) {
              *(undefined8 *)(lVar16 + -8) = 0x10a04a;
              _nindnum = appendidx(*(rnndeccontext **)(lVar16 + 0x18),*(char **)(lVar16 + 0x10),
                                   *(uint64_t *)(lVar16 + 8));
            }
            pcVar8 = _nindnum;
            pcVar14 = *(char **)&_j->varsnum;
            *(undefined8 *)(lVar16 + -8) = 0x10a06c;
            asprintf(&name,"%s.%s",pcVar8,pcVar14);
            pcVar14 = _nindnum;
            *(undefined8 *)(lVar16 + -8) = 0x10a075;
            free(pcVar14);
            pcVar14 = *(char **)&_j->varsnum;
            *(undefined8 *)(lVar16 + -8) = 0x10a082;
            free(pcVar14);
            *(char **)&_j->varsnum = name;
            ctx_local = _j;
            local_84 = 1;
          }
          if (local_84 == 1) {
            return (rnndecaddrinfo *)ctx_local;
          }
          tmp = tmp + 1;
          puVar17 = (undefined1 *)__vla_expr0;
        }
      }
    }
    offset._4_4_ = offset._4_4_ + 1;
  } while( true );
}

Assistant:

static struct rnndecaddrinfo *trymatch (struct rnndeccontext *ctx, struct rnndelem **elems, int elemsnum, uint64_t addr, int write, int dwidth, uint64_t *indices, int indicesnum) {
	struct rnndecaddrinfo *res;
	int i, j;
	for (i = 0; i < elemsnum; i++) {
		if (!rnndec_varmatch(ctx, &elems[i]->varinfo))
			continue;
		uint64_t offset, idx;
		char *tmp, *name;
		switch (elems[i]->type) {
			case RNN_ETYPE_REG:
				if (addr < elems[i]->offset)
					break;
				if (elems[i]->stride) {
					idx = (addr-elems[i]->offset)/elems[i]->stride;
					offset = (addr-elems[i]->offset)%elems[i]->stride;
				} else {
					idx = 0;
					offset = addr-elems[i]->offset;
				}
				if (offset >= elems[i]->width/dwidth)
					break;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				res = calloc (sizeof *res, 1);
				res->typeinfo = &elems[i]->typeinfo;
				res->width = elems[i]->width;
				asprintf (&res->name, "%s%s%s", ctx->colors->cname, elems[i]->name, ctx->colors->cend);
				for (j = 0; j < indicesnum; j++)
					res->name = appendidx(ctx, res->name, indices[j]);
				if (elems[i]->length != 1)
					res->name = appendidx(ctx, res->name, idx);
				if (offset) {
					asprintf (&tmp, "%s+%s%#"PRIx64"%s", res->name, ctx->colors->cerr, offset, ctx->colors->cend);
					free(res->name);
					res->name = tmp;
				}
				return res;
			case RNN_ETYPE_STRIPE:
				for (idx = 0; idx < elems[i]->length || !elems[i]->length; idx++) {
					if (addr < elems[i]->offset + elems[i]->stride * idx)
						break;
					offset = addr - (elems[i]->offset + elems[i]->stride * idx);
					int extraidx = (elems[i]->length != 1);
					int nindnum = (elems[i]->name ? 0 : indicesnum + extraidx);
					uint64_t nind[nindnum];
					if (!elems[i]->name) {
						for (j = 0; j < indicesnum; j++)
							nind[j] = indices[j];
						if (extraidx)
							nind[indicesnum] = idx;
					}
					res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, nind, nindnum);
					if (!res)
						continue;
					if (!elems[i]->name)
						return res;
					asprintf (&name, "%s%s%s", ctx->colors->cname, elems[i]->name, ctx->colors->cend);
					for (j = 0; j < indicesnum; j++)
						name = appendidx(ctx, name, indices[j]);
					if (elems[i]->length != 1)
						name = appendidx(ctx, name, idx);
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				break;
			case RNN_ETYPE_ARRAY:
				if (addr < elems[i]->offset)
					break;
				idx = (addr-elems[i]->offset)/elems[i]->stride;
				offset = (addr-elems[i]->offset)%elems[i]->stride;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				asprintf (&name, "%s%s%s", ctx->colors->cname, elems[i]->name, ctx->colors->cend);
				for (j = 0; j < indicesnum; j++)
					name = appendidx(ctx, name, indices[j]);
				if (elems[i]->length != 1)
					name = appendidx(ctx, name, idx);
				if ((res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, 0, 0))) {
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				res = calloc (sizeof *res, 1);
				asprintf (&tmp, "%s+%s%#"PRIx64"%s", name, ctx->colors->cerr, offset, ctx->colors->cend);
				free(name);
				res->name = tmp;
				return res;
			default:
				break;
		}
	}
	return 0;
}